

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketAcceptor.cpp
# Opt level: O1

void __thiscall FIX::SocketAcceptor::onStart(SocketAcceptor *this)

{
  Strategy *strategy;
  SocketServer *this_00;
  bool bVar1;
  time_t tVar2;
  int __fd;
  Strategy *in_RSI;
  time_t start;
  time_t now;
  time_t local_28 [2];
  
  strategy = &this->super_Strategy;
  do {
    if ((((this->super_Acceptor).m_stop._M_base._M_i & 1U) != 0) ||
       (this->m_pServer == (SocketServer *)0x0)) break;
    in_RSI = strategy;
    bVar1 = SocketServer::block(this->m_pServer,strategy,false,0.0);
  } while (bVar1);
  if (this->m_pServer != (SocketServer *)0x0) {
    local_28[0] = 0;
    local_28[1] = 0;
    time(local_28);
    do {
      __fd = (int)in_RSI;
      bVar1 = Acceptor::isLoggedOn(&this->super_Acceptor);
      if (!bVar1) break;
      in_RSI = strategy;
      SocketServer::block(this->m_pServer,strategy,false,0.0);
      tVar2 = time(local_28 + 1);
      __fd = (int)in_RSI;
    } while (tVar2 + -5 < local_28[0]);
    SocketServer::close(this->m_pServer,__fd);
    this_00 = this->m_pServer;
    if (this_00 != (SocketServer *)0x0) {
      SocketMonitor::~SocketMonitor(&this_00->m_monitor);
      std::
      _Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
      ::~_Rb_tree(&(this_00->m_portToInfo)._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
      ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_FIX::SocketInfo>,_std::_Select1st<std::pair<const_int,_FIX::SocketInfo>_>,_std::less<int>,_std::allocator<std::pair<const_int,_FIX::SocketInfo>_>_>
                   *)this_00);
      operator_delete(this_00,0x160);
    }
    this->m_pServer = (SocketServer *)0x0;
  }
  return;
}

Assistant:

void SocketAcceptor::onStart() {
  while (!isStopped() && m_pServer && m_pServer->block(*this)) {}

  if (!m_pServer) {
    return;
  }

  time_t start = 0;
  time_t now = 0;

  ::time(&start);
  while (isLoggedOn()) {
    m_pServer->block(*this);
    if (::time(&now) - 5 >= start) {
      break;
    }
  }

  m_pServer->close();
  delete m_pServer;
  m_pServer = 0;
}